

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_dfs.c
# Opt level: O3

lu_int lu_dfs(lu_int i,lu_int *begin,lu_int *end,lu_int *index,lu_int top,lu_int *xi,lu_int *pstack,
             lu_int *marked,lu_int M)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint *puVar9;
  
  if (marked[i] != M) {
    *xi = i;
    if (end == (lu_int *)0x0) {
      uVar4 = 0;
      do {
        uVar1 = xi[uVar4];
        if (marked[(int)uVar1] == M) {
          iVar7 = pstack[uVar4];
        }
        else {
          marked[(int)uVar1] = M;
          iVar7 = begin[(int)uVar1];
          pstack[uVar4] = iVar7;
        }
        uVar3 = index[iVar7];
        if (-1 < (int)uVar3) {
          puVar9 = (uint *)(index + (long)iVar7 + 1);
          do {
            iVar7 = iVar7 + 1;
            if (marked[uVar3] != M) {
              pstack[uVar4] = iVar7;
              uVar4 = uVar4 + 1;
              uVar8 = (ulong)uVar4;
              goto LAB_003b4dae;
            }
            uVar3 = *puVar9;
            puVar9 = puVar9 + 1;
          } while (-1 < (int)uVar3);
        }
        uVar4 = uVar4 - 1;
        top = top + -1;
        uVar8 = (ulong)top;
        uVar3 = uVar1;
LAB_003b4dae:
        xi[uVar8] = uVar3;
      } while (-1 < (int)uVar4);
    }
    else {
      uVar4 = 0;
      do {
        iVar7 = xi[uVar4];
        if (marked[iVar7] == M) {
          iVar6 = pstack[uVar4];
        }
        else {
          marked[iVar7] = M;
          iVar6 = begin[iVar7];
          pstack[uVar4] = iVar6;
        }
        if (iVar6 < end[iVar7]) {
          piVar5 = index + iVar6;
          do {
            iVar6 = iVar6 + 1;
            iVar2 = *piVar5;
            if (marked[iVar2] != M) {
              pstack[uVar4] = iVar6;
              uVar4 = uVar4 + 1;
              uVar8 = (ulong)uVar4;
              goto LAB_003b4d3d;
            }
            piVar5 = piVar5 + 1;
          } while (iVar6 != end[iVar7]);
        }
        uVar4 = uVar4 - 1;
        top = top + -1;
        uVar8 = (ulong)top;
        iVar2 = iVar7;
LAB_003b4d3d:
        xi[uVar8] = iVar2;
      } while (-1 < (int)uVar4);
    }
  }
  return top;
}

Assistant:

lu_int lu_dfs(
    lu_int i, const lu_int *begin, const lu_int *end, const lu_int *index,
    lu_int top, lu_int *xi, lu_int *pstack, lu_int *marked, const lu_int M)
{
    if (marked[i] == M)
        return top;

    return end ?
        dfs_end(i, begin, end, index, top, xi, pstack, marked, M) :
        dfs(i, begin, index, top, xi, pstack, marked, M);
}